

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O2

vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *
tinyusdz::lerp<tinyusdz::value::color3f>
          (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *a,
          vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *b,double t)

{
  pointer pcVar1;
  ulong __new_size;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  color3f cVar5;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __new_size = ((long)(a->
                      super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(a->
                     super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 0xc;
  uVar2 = ((long)(b->
                 super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(b->
                super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0xc;
  if (uVar2 < __new_size) {
    __new_size = uVar2;
  }
  if (__new_size != 0) {
    ::std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::resize
              (__return_storage_ptr__,__new_size);
    if ((long)(a->
              super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
              )._M_impl.super__Vector_impl_data._M_start ==
        (long)(b->
              super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(b->
              super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      lVar3 = 0;
      while (bVar4 = __new_size != 0, __new_size = __new_size - 1, bVar4) {
        cVar5 = lerp<tinyusdz::value::color3f>
                          ((color3f *)
                           ((long)&((a->
                                    super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->r + lVar3),
                           (color3f *)
                           ((long)&((b->
                                    super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->r + lVar3),t);
        pcVar1 = (__return_storage_ptr__->
                 super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(long *)((long)&pcVar1->r + lVar3) = cVar5._0_8_;
        *(float *)((long)&pcVar1->b + lVar3) = cVar5.b;
        lVar3 = lVar3 + 0xc;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}